

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Tracks::ParseTrackEntry
          (Tracks *this,longlong track_start,longlong track_size,longlong element_start,
          longlong element_size,Track **pResult)

{
  longlong lVar1;
  long lVar2;
  unsigned_long_long uVar3;
  Track *pTVar4;
  long status_9;
  Track *pTrack_2;
  long status_8;
  AudioTrack *pTrack_1;
  long status_7;
  VideoTrack *pTrack;
  long status_6;
  uchar *puStack_190;
  int status_5;
  uchar *buf;
  size_t buflen;
  long status_4;
  longlong duration;
  long status_3;
  long status_2;
  longlong type;
  longlong num;
  int status_1;
  uchar b;
  longlong pos_end;
  longlong pos_;
  longlong start;
  Tracks *local_120;
  long status;
  longlong size;
  longlong id;
  longlong lacing;
  Settings e;
  Settings a;
  Settings v;
  Info info;
  longlong track_stop;
  longlong pos;
  IMkvReader *pReader;
  Track **pResult_local;
  longlong element_size_local;
  longlong element_start_local;
  longlong track_size_local;
  longlong track_start_local;
  Tracks *this_local;
  
  if (*pResult != (Track *)0x0) {
    return -1;
  }
  pos = (longlong)this->m_pSegment->m_pReader;
  info.settings.size = track_start + track_size;
  track_stop = track_start;
  pReader = (IMkvReader *)pResult;
  pResult_local = (Track **)element_size;
  element_size_local = element_start;
  element_start_local = track_size;
  track_size_local = track_start;
  track_start_local = (longlong)this;
  Track::Info::Info((Info *)&v.size);
  v.size = 0;
  info.type = 0;
  info.number = 0;
  info.uid = 0;
  a.size = -1;
  v.start = -1;
  e.size = -1;
  a.start = -1;
  lacing = -1;
  e.start = -1;
  id = 1;
LAB_0012eb1f:
  if (info.settings.size <= track_stop) {
    if (track_stop != info.settings.size) {
      this_local = (Tracks *)0xfffffffffffffffe;
      goto LAB_0012f703;
    }
    if (info.type < 1) {
      this_local = (Tracks *)0xfffffffffffffffe;
      goto LAB_0012f703;
    }
    pTVar4 = GetTrackByNumber(this,info.type);
    if (pTVar4 != (Track *)0x0) {
      this_local = (Tracks *)0xfffffffffffffffe;
      goto LAB_0012f703;
    }
    if (v.size < 1) {
      this_local = (Tracks *)0xfffffffffffffffe;
      goto LAB_0012f703;
    }
    info.codecPrivateSize._0_1_ = -(0 < id) & 1;
    if (v.size == 1) {
      if (a.size < 0) {
        this_local = (Tracks *)0xfffffffffffffffe;
        goto LAB_0012f703;
      }
      if (-1 < e.size) {
        this_local = (Tracks *)0xfffffffffffffffe;
        goto LAB_0012f703;
      }
      info._96_8_ = a.size;
      info.settings.start = v.start;
      status_7 = 0;
      pTrack_1 = (AudioTrack *)
                 VideoTrack::Parse(this->m_pSegment,(Info *)&v.size,element_size_local,
                                   (longlong)pResult_local,(VideoTrack **)&status_7);
      this_local = (Tracks *)pTrack_1;
      if (pTrack_1 != (AudioTrack *)0x0) goto LAB_0012f703;
      pReader->_vptr_IMkvReader = (_func_int **)status_7;
      if (pReader->_vptr_IMkvReader == (_func_int **)0x0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1734,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
      if (-1 < lacing) {
        Track::ParseContentEncodingsEntry((Track *)pReader->_vptr_IMkvReader,lacing,e.start);
      }
    }
    else if (v.size == 2) {
      if (e.size < 0) {
        this_local = (Tracks *)0xfffffffffffffffe;
        goto LAB_0012f703;
      }
      if (-1 < a.size) {
        this_local = (Tracks *)0xfffffffffffffffe;
        goto LAB_0012f703;
      }
      info._96_8_ = e.size;
      info.settings.start = a.start;
      status_8 = 0;
      pTrack_2 = (Track *)AudioTrack::Parse(this->m_pSegment,(Info *)&v.size,element_size_local,
                                            (longlong)pResult_local,(AudioTrack **)&status_8);
      this_local = (Tracks *)pTrack_2;
      if (pTrack_2 != (Track *)0x0) goto LAB_0012f703;
      pReader->_vptr_IMkvReader = (_func_int **)status_8;
      if (pReader->_vptr_IMkvReader == (_func_int **)0x0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x174a,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
      if (-1 < lacing) {
        Track::ParseContentEncodingsEntry((Track *)pReader->_vptr_IMkvReader,lacing,e.start);
      }
    }
    else {
      if (-1 < e.size) {
        this_local = (Tracks *)0xfffffffffffffffe;
        goto LAB_0012f703;
      }
      if (-1 < a.size) {
        this_local = (Tracks *)0xfffffffffffffffe;
        goto LAB_0012f703;
      }
      if ((v.size == 0x21) && (-1 < lacing)) {
        this_local = (Tracks *)0xfffffffffffffffe;
        goto LAB_0012f703;
      }
      info.lacing = true;
      info._97_7_ = 0xffffffffffffff;
      info.settings.start = 0;
      status_9 = 0;
      this_local = (Tracks *)
                   Track::Create(this->m_pSegment,(Info *)&v.size,element_size_local,
                                 (longlong)pResult_local,(Track **)&status_9);
      if (this_local != (Tracks *)0x0) goto LAB_0012f703;
      pReader->_vptr_IMkvReader = (_func_int **)status_9;
      if (pReader->_vptr_IMkvReader == (_func_int **)0x0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1766,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
    }
    this_local = (Tracks *)0x0;
    goto LAB_0012f703;
  }
  local_120 = (Tracks *)
              ParseElementHeader((IMkvReader *)pos,&track_stop,info.settings.size,&size,&status);
  this_local = local_120;
  if ((long)local_120 < 0) goto LAB_0012f703;
  if (status < 0) {
    this_local = (Tracks *)0xfffffffffffffffe;
    goto LAB_0012f703;
  }
  pos_ = track_stop;
  lVar1 = v.size;
  lVar2 = info.type;
  uVar3 = info.uid;
  if (size == 0xe0) {
    a.size = track_stop;
    v.start = status;
  }
  else if (size == 0xe1) {
    e.size = track_stop;
    a.start = status;
  }
  else if (size == 0x6d80) {
    lacing = track_stop;
    e.start = status;
  }
  else if (size == 0x73c5) {
    if (8 < status) {
      this_local = (Tracks *)0xfffffffffffffffe;
      goto LAB_0012f703;
    }
    info.number = 0;
    _status_1 = track_stop + status;
    for (pos_end = track_stop; lVar1 = v.size, lVar2 = info.type, uVar3 = info.uid,
        pos_end != _status_1; pos_end = pos_end + 1) {
      num._0_4_ = (*(code *)**(undefined8 **)pos)(pos,pos_end,1,(long)&num + 7);
      if ((int)num != 0) {
        this_local = (Tracks *)(long)(int)num;
        goto LAB_0012f703;
      }
      info.number = (ulong)num._7_1_ | info.number << 8;
    }
  }
  else if (size == 0xd7) {
    type = UnserializeUInt((IMkvReader *)pos,track_stop,status);
    if ((type < 1) || (lVar1 = v.size, lVar2 = type, uVar3 = info.uid, 0x7f < type)) {
      this_local = (Tracks *)0xfffffffffffffffe;
      goto LAB_0012f703;
    }
  }
  else if (size == 0x83) {
    status_2 = UnserializeUInt((IMkvReader *)pos,track_stop,status);
    if ((status_2 < 1) || (lVar1 = status_2, lVar2 = info.type, uVar3 = info.uid, 0xfe < status_2))
    {
      this_local = (Tracks *)0xfffffffffffffffe;
      goto LAB_0012f703;
    }
  }
  else {
    if (size == 0x536e) {
      this_local = (Tracks *)
                   UnserializeString((IMkvReader *)pos,track_stop,status,(char **)&info.seekPreRoll)
      ;
      status_3 = (long)this_local;
    }
    else {
      if (size != 0x22b59c) {
        if (size == 0x23e383) {
          status_4 = UnserializeUInt((IMkvReader *)pos,track_stop,status);
          lVar1 = v.size;
          lVar2 = info.type;
          uVar3 = status_4;
          if (status_4 < 0) {
            this_local = (Tracks *)0xfffffffffffffffe;
            goto LAB_0012f703;
          }
        }
        else {
          if (size == 0x86) {
            this_local = (Tracks *)
                         UnserializeString((IMkvReader *)pos,track_stop,status,&info.language);
            buflen = (size_t)this_local;
            goto joined_r0x0012f1df;
          }
          if (size == 0x9c) {
            id = UnserializeUInt((IMkvReader *)pos,track_stop,status);
            if ((id < 0) || (lVar1 = v.size, lVar2 = info.type, uVar3 = info.uid, 1 < id)) {
              this_local = (Tracks *)0xfffffffffffffffe;
              goto LAB_0012f703;
            }
          }
          else if (size == 0x63a2) {
            if (info.codecNameAsUTF8 != (char *)0x0) {
              operator_delete__(info.codecNameAsUTF8);
            }
            info.codecNameAsUTF8 = (char *)0x0;
            info.codecPrivate = (uchar *)0x0;
            buf = (uchar *)status;
            lVar1 = v.size;
            lVar2 = info.type;
            uVar3 = info.uid;
            if (status != 0) {
              puStack_190 = SafeArrayAlloc<unsigned_char>(1,status);
              if (puStack_190 == (uchar *)0x0) {
                this_local = (Tracks *)0xffffffffffffffff;
              }
              else {
                status_6._4_4_ = (*(code *)**(undefined8 **)pos)(pos,track_stop,buf,puStack_190);
                if (status_6._4_4_ == 0) {
                  info.codecNameAsUTF8 = (char *)puStack_190;
                  info.codecPrivate = buf;
                  lVar1 = v.size;
                  lVar2 = info.type;
                  uVar3 = info.uid;
                  goto LAB_0012f28b;
                }
                if (puStack_190 != (uchar *)0x0) {
                  operator_delete__(puStack_190);
                }
                this_local = (Tracks *)(long)status_6._4_4_;
              }
              goto LAB_0012f703;
            }
          }
          else {
            if (size == 0x258688) {
              this_local = (Tracks *)
                           UnserializeString((IMkvReader *)pos,track_stop,status,&info.codecId);
              pTrack = (VideoTrack *)this_local;
              goto joined_r0x0012f1df;
            }
            if (size == 0x56aa) {
              info.defaultDuration = UnserializeUInt((IMkvReader *)pos,track_stop,status);
              lVar1 = v.size;
              lVar2 = info.type;
              uVar3 = info.uid;
            }
            else if (size == 0x56bb) {
              info.codecDelay = UnserializeUInt((IMkvReader *)pos,track_stop,status);
              lVar1 = v.size;
              lVar2 = info.type;
              uVar3 = info.uid;
            }
          }
        }
        goto LAB_0012f28b;
      }
      this_local = (Tracks *)UnserializeString((IMkvReader *)pos,track_stop,status,&info.nameAsUTF8)
      ;
      duration = (longlong)this_local;
    }
joined_r0x0012f1df:
    lVar1 = v.size;
    lVar2 = info.type;
    uVar3 = info.uid;
    if ((VideoTrack *)this_local != (VideoTrack *)0x0) goto LAB_0012f703;
  }
LAB_0012f28b:
  info.uid = uVar3;
  info.type = lVar2;
  v.size = lVar1;
  track_stop = status + track_stop;
  if (info.settings.size < track_stop) {
    this_local = (Tracks *)0xfffffffffffffffe;
LAB_0012f703:
    start._0_4_ = 1;
    Track::Info::~Info((Info *)&v.size);
    return (long)this_local;
  }
  goto LAB_0012eb1f;
}

Assistant:

long Tracks::ParseTrackEntry(long long track_start, long long track_size,
                             long long element_start, long long element_size,
                             Track*& pResult) const {
  if (pResult)
    return -1;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = track_start;
  const long long track_stop = track_start + track_size;

  Track::Info info;

  info.type = 0;
  info.number = 0;
  info.uid = 0;
  info.defaultDuration = 0;

  Track::Settings v;
  v.start = -1;
  v.size = -1;

  Track::Settings a;
  a.start = -1;
  a.size = -1;

  Track::Settings e;  // content_encodings_settings;
  e.start = -1;
  e.size = -1;

  long long lacing = 1;  // default is true

  while (pos < track_stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, track_stop, id, size);

    if (status < 0)  // error
      return status;

    if (size < 0)
      return E_FILE_FORMAT_INVALID;

    const long long start = pos;

    if (id == libwebm::kMkvVideo) {
      v.start = start;
      v.size = size;
    } else if (id == libwebm::kMkvAudio) {
      a.start = start;
      a.size = size;
    } else if (id == libwebm::kMkvContentEncodings) {
      e.start = start;
      e.size = size;
    } else if (id == libwebm::kMkvTrackUID) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      info.uid = 0;

      long long pos_ = start;
      const long long pos_end = start + size;

      while (pos_ != pos_end) {
        unsigned char b;

        const int status = pReader->Read(pos_, 1, &b);

        if (status)
          return status;

        info.uid <<= 8;
        info.uid |= b;

        ++pos_;
      }
    } else if (id == libwebm::kMkvTrackNumber) {
      const long long num = UnserializeUInt(pReader, pos, size);

      if ((num <= 0) || (num > 127))
        return E_FILE_FORMAT_INVALID;

      info.number = static_cast<long>(num);
    } else if (id == libwebm::kMkvTrackType) {
      const long long type = UnserializeUInt(pReader, pos, size);

      if ((type <= 0) || (type > 254))
        return E_FILE_FORMAT_INVALID;

      info.type = static_cast<long>(type);
    } else if (id == libwebm::kMkvName) {
      const long status =
          UnserializeString(pReader, pos, size, info.nameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvLanguage) {
      const long status = UnserializeString(pReader, pos, size, info.language);

      if (status)
        return status;
    } else if (id == libwebm::kMkvDefaultDuration) {
      const long long duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;

      info.defaultDuration = static_cast<unsigned long long>(duration);
    } else if (id == libwebm::kMkvCodecID) {
      const long status = UnserializeString(pReader, pos, size, info.codecId);

      if (status)
        return status;
    } else if (id == libwebm::kMkvFlagLacing) {
      lacing = UnserializeUInt(pReader, pos, size);

      if ((lacing < 0) || (lacing > 1))
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvCodecPrivate) {
      delete[] info.codecPrivate;
      info.codecPrivate = NULL;
      info.codecPrivateSize = 0;

      const size_t buflen = static_cast<size_t>(size);

      if (buflen) {
        unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);

        if (buf == NULL)
          return -1;

        const int status = pReader->Read(pos, static_cast<long>(buflen), buf);

        if (status) {
          delete[] buf;
          return status;
        }

        info.codecPrivate = buf;
        info.codecPrivateSize = buflen;
      }
    } else if (id == libwebm::kMkvCodecName) {
      const long status =
          UnserializeString(pReader, pos, size, info.codecNameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvCodecDelay) {
      info.codecDelay = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvSeekPreRoll) {
      info.seekPreRoll = UnserializeUInt(pReader, pos, size);
    }

    pos += size;  // consume payload
    if (pos > track_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != track_stop)
    return E_FILE_FORMAT_INVALID;

  if (info.number <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  if (GetTrackByNumber(info.number))
    return E_FILE_FORMAT_INVALID;

  if (info.type <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  info.lacing = (lacing > 0) ? true : false;

  if (info.type == Track::kVideo) {
    if (v.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = v;

    VideoTrack* pTrack = NULL;

    const long status = VideoTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else if (info.type == Track::kAudio) {
    if (a.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = a;

    AudioTrack* pTrack = NULL;

    const long status = AudioTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else {
    // neither video nor audio - probably metadata or subtitles

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (info.type == Track::kMetadata && e.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings.start = -1;
    info.settings.size = 0;

    Track* pTrack = NULL;

    const long status =
        Track::Create(m_pSegment, info, element_start, element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);
  }

  return 0;  // success
}